

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<_25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<_9>,_Detail::M3<_21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [624];
  uint *local_9e0;
  uint local_9d8 [2];
  undefined8 auStack_9d0 [311];
  uint local_18 [2];
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)auStack_9d0 + lVar2 * 4 + -8) = 0x100000001;
    *(undefined8 *)((long)auStack_9d0 + lVar2 * 4) = 0x100000001;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x270);
  local_9e0 = local_9d8;
  Well<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,Detail::M3<-25>,Detail::M3<27>,Detail::M2<9>,Detail::M3<1>,Detail::M1,Detail::M3<-9>,Detail::M3<-21>,Detail::M3<21>,Detail::MatsumotoKuritaTempering<3832420096u,2609283072u>>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,Detail::M3<_25>,Detail::M3<27>,Detail::M2<9>,Detail::M3<1>,Detail::M1,Detail::M3<_9>,Detail::M3<_21>,Detail::M3<21>,Detail::MatsumotoKuritaTempering<3832420096u,2609283072u>>
              *)this,&local_9e0,local_18);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }